

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrawfont.cpp
# Opt level: O0

QRawFont QRawFont::fromFont(QFont *font,WritingSystem writingSystem)

{
  uint uVar1;
  int iVar2;
  Type TVar3;
  HintingPreference HVar4;
  QRawFontPrivate *pQVar5;
  WritingSystem in_EDX;
  undefined8 in_RSI;
  QFontEngineMulti *in_RDI;
  long in_FS_OFFSET;
  QFontEngine *engine;
  QFontEngineMulti *multiEngine;
  QFontEngine *fe;
  int script;
  QFontPrivate *font_d;
  QRawFont *rawFont;
  QFontDef request;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  QExplicitlySharedDataPointer<QRawFontPrivate> engine_00;
  QFontEngine *in_stack_ffffffffffffff50;
  QFontPrivate *in_stack_ffffffffffffff58;
  QFontEngine *local_a0;
  QFontEngineMulti *req;
  undefined1 local_70 [96];
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->super_QFontEngine)._vptr_QFontEngine = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  engine_00.d.ptr =
       (totally_ordered_wrapper<QRawFontPrivate_*>)
       (totally_ordered_wrapper<QRawFontPrivate_*>)in_RDI;
  req = in_RDI;
  QRawFont((QRawFont *)in_RDI);
  QFontPrivate::get((QFont *)0x791f55);
  iVar2 = qt_script_for_writing_system(in_EDX);
  local_a0 = QFontPrivate::engineForScript
                       (in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  if (((local_a0 != (QFontEngine *)0x0) && (TVar3 = QFontEngine::type(local_a0), TVar3 == Multi)) &&
     (local_a0 = QFontEngineMulti::engine(in_RDI,in_stack_ffffffffffffff3c), 3 < iVar2)) {
    memcpy(local_70,&DAT_00bcf4c0,0x68);
    QFontDef::QFontDef((QFontDef *)in_RDI,
                       (QFontDef *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_10 = local_10 & 0xffffffffffff0000 | (ulong)((uint)local_10 & 0xffff | 0x8000);
    in_stack_ffffffffffffff50 =
         QFontDatabasePrivate::findFont
                   ((QFontDef *)req,(int)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
    if (in_stack_ffffffffffffff50 != (QFontEngine *)0x0) {
      uVar1 = (uint)(local_10 >> 0x20);
      if (400 < (uVar1 >> 8 & 0x3ff)) {
        *(ulong *)&(in_stack_ffffffffffffff50->fontDef).field_0x60 =
             *(ulong *)&(in_stack_ffffffffffffff50->fontDef).field_0x60 & 0xfffc00ffffffffff |
             (ulong)(uVar1 >> 8 & 0x3ff) << 0x28;
      }
      local_a0 = in_stack_ffffffffffffff50;
      if ((local_10 >> 0x1c & 3) != 0) {
        *(ulong *)&(in_stack_ffffffffffffff50->fontDef).field_0x60 =
             *(ulong *)&(in_stack_ffffffffffffff50->fontDef).field_0x60 & 0xffffffffcfffffff |
             (ulong)((uint)(local_10 >> 0x1c) & 3) << 0x1c;
      }
    }
    QFontDef::~QFontDef((QFontDef *)in_RDI);
  }
  if (local_a0 != (QFontEngine *)0x0) {
    QExplicitlySharedDataPointer<QRawFontPrivate>::data
              ((QExplicitlySharedDataPointer<QRawFontPrivate> *)0x79210e);
    QRawFontPrivate::setFontEngine
              ((QRawFontPrivate *)in_stack_ffffffffffffff50,(QFontEngine *)engine_00.d.ptr);
    HVar4 = QFont::hintingPreference((QFont *)0x792125);
    pQVar5 = QExplicitlySharedDataPointer<QRawFontPrivate>::data
                       ((QExplicitlySharedDataPointer<QRawFontPrivate> *)0x792133);
    pQVar5->hintingPreference = HVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QExplicitlySharedDataPointer<QRawFontPrivate>)
           (QExplicitlySharedDataPointer<QRawFontPrivate>)engine_00.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QRawFont QRawFont::fromFont(const QFont &font, QFontDatabase::WritingSystem writingSystem)
{
    QRawFont rawFont;
    const QFontPrivate *font_d = QFontPrivate::get(font);
    int script = qt_script_for_writing_system(writingSystem);
    QFontEngine *fe = font_d->engineForScript(script);

    if (fe != nullptr && fe->type() == QFontEngine::Multi) {
        QFontEngineMulti *multiEngine = static_cast<QFontEngineMulti *>(fe);
        fe = multiEngine->engine(0);

        if (script > QChar::Script_Latin) {
            // keep in sync with QFontEngineMulti::loadEngine()
            QFontDef request(multiEngine->fontDef);
            request.styleStrategy |= QFont::NoFontMerging;

            if (QFontEngine *engine = QFontDatabasePrivate::findFont(request, script, true)) {
                if (request.weight > QFont::Normal)
                    engine->fontDef.weight = request.weight;
                if (request.style > QFont::StyleNormal)
                    engine->fontDef.style = request.style;
                fe = engine;
            }
        }
        Q_ASSERT(fe);
    }

    if (fe != nullptr) {
        rawFont.d.data()->setFontEngine(fe);
        rawFont.d.data()->hintingPreference = font.hintingPreference();
    }
    return rawFont;
}